

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

int read_segment_id(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r,int skip)

{
  aom_cdf_prob *paVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  FRAME_CONTEXT *pFVar7;
  short sVar8;
  uint uVar9;
  int iVar10;
  uint ref;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  byte bVar15;
  aom_cdf_prob (*icdf) [9];
  
  iVar10 = xd->mi_row;
  iVar4 = xd->mi_col;
  puVar6 = cm->cur_frame->seg_map;
  uVar9 = 0xff;
  if ((((xd->up_available == true) && (xd->left_available == true)) &&
      (uVar9 = 8, iVar10 <= (cm->mi_params).mi_rows)) &&
     (iVar5 = (cm->mi_params).mi_cols, iVar4 <= iVar5)) {
    bVar15 = 8;
    if (puVar6[iVar5 * (iVar10 + -1) + iVar4 + -1] < 8) {
      bVar15 = puVar6[iVar5 * (iVar10 + -1) + iVar4 + -1];
    }
    uVar9 = (uint)bVar15;
  }
  uVar11 = 0xff;
  if (((xd->up_available != false) && (uVar11 = 8, iVar10 <= (cm->mi_params).mi_rows)) &&
     (iVar5 = (cm->mi_params).mi_cols, iVar4 < iVar5)) {
    uVar11 = 8;
    if (puVar6[iVar5 * (iVar10 + -1) + iVar4] < 8) {
      uVar11 = (uint)puVar6[iVar5 * (iVar10 + -1) + iVar4];
    }
  }
  uVar14 = 0xff;
  if (((xd->left_available == true) && (uVar14 = 8, iVar10 < (cm->mi_params).mi_rows)) &&
     (iVar5 = (cm->mi_params).mi_cols, iVar4 <= iVar5)) {
    uVar14 = 8;
    if (puVar6[iVar5 * iVar10 + iVar4 + -1] < 8) {
      uVar14 = (uint)puVar6[iVar5 * iVar10 + iVar4 + -1];
    }
  }
  if (uVar9 == 0xff) {
    uVar12 = 0;
  }
  else if ((uVar9 != uVar11) || (uVar12 = 2, uVar9 != uVar14)) {
    uVar12 = (ulong)((uVar14 == uVar11 || uVar9 == uVar14) || uVar9 == uVar11);
  }
  if ((char)uVar11 == -1) {
    ref = 0;
    if (uVar14 != 0xff) {
      ref = uVar14;
    }
  }
  else {
    ref = uVar11;
    if ((uVar14 != 0xff) && (ref = uVar14, uVar9 == uVar11)) {
      ref = uVar11;
    }
  }
  if (skip == 0) {
    pFVar7 = xd->tile_ctx;
    icdf = (pFVar7->seg).spatial_pred_seg_cdf + uVar12;
    iVar10 = od_ec_decode_cdf_q15(&r->ec,*icdf,8);
    if (r->allow_update_cdf != '\0') {
      uVar2 = (pFVar7->seg).spatial_pred_seg_cdf[uVar12][8];
      bVar15 = (char)(uVar2 >> 4) + 5;
      lVar13 = 0;
      do {
        uVar3 = (*icdf)[lVar13];
        if (lVar13 < (char)iVar10) {
          sVar8 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar15 & 0x1f));
        }
        else {
          sVar8 = -(uVar3 >> (bVar15 & 0x1f));
        }
        (*icdf)[lVar13] = sVar8 + uVar3;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 7);
      paVar1 = (pFVar7->seg).spatial_pred_seg_cdf[uVar12] + 8;
      *paVar1 = *paVar1 + (ushort)(uVar2 < 0x20);
    }
    iVar4 = (cm->seg).last_active_segid;
    ref = av1_neg_deinterleave(iVar10,ref,iVar4 + 1);
    if ((int)ref < 0 || iVar4 < (int)ref) {
      aom_internal_error(xd->error_info,AOM_CODEC_CORRUPT_FRAME,"Corrupted segment_ids");
    }
  }
  return ref;
}

Assistant:

static int read_segment_id(AV1_COMMON *const cm, const MACROBLOCKD *const xd,
                           aom_reader *r, int skip) {
  int cdf_num;
  const uint8_t pred = av1_get_spatial_seg_pred(cm, xd, &cdf_num, 0);
  if (skip) return pred;

  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  struct segmentation *const seg = &cm->seg;
  struct segmentation_probs *const segp = &ec_ctx->seg;
  aom_cdf_prob *pred_cdf = segp->spatial_pred_seg_cdf[cdf_num];
  const int coded_id = aom_read_symbol(r, pred_cdf, MAX_SEGMENTS, ACCT_STR);
  const int segment_id =
      av1_neg_deinterleave(coded_id, pred, seg->last_active_segid + 1);

  if (segment_id < 0 || segment_id > seg->last_active_segid) {
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Corrupted segment_ids");
  }
  return segment_id;
}